

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void testing::internal::TuplePrefix<2ul>::
     ExplainMatchFailuresTo<std::tr1::tuple<testing::Matcher<char*>,testing::Matcher<unsigned_long>,void,void,void,void,void,void,void,void>,std::tr1::tuple<char*,unsigned_long,void,void,void,void,void,void,void,void>>
               (tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
                *matchers,
               tuple<char_*,_unsigned_long,_void,_void,_void,_void,_void,_void,_void,_void> *values,
               ostream *os)

{
  bool bVar1;
  ostream *this;
  StringMatchResultListener *this_00;
  tuple<char_*,_unsigned_long,_void,_void,_void,_void,_void,_void,_void,_void> *in_RDX;
  tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
  *in_RSI;
  StringMatchResultListener listener;
  Value value;
  type matcher;
  Matcher<unsigned_long> *in_stack_fffffffffffffdd8;
  StringMatchResultListener *in_stack_fffffffffffffde0;
  StringMatchResultListener *in_stack_fffffffffffffe00;
  ostream *in_stack_ffffffffffffffe0;
  
  TuplePrefix<1ul>::
  ExplainMatchFailuresTo<std::tr1::tuple<testing::Matcher<char*>,testing::Matcher<unsigned_long>,void,void,void,void,void,void,void,void>,std::tr1::tuple<char*,unsigned_long,void,void,void,void,void,void,void,void>>
            (in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  std::tr1::
  get<1,testing::Matcher<char*>,testing::Matcher<unsigned_long>,void,void,void,void,void,void,void,void>
            ((tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
              *)0x1ba869);
  Matcher<unsigned_long>::Matcher
            ((Matcher<unsigned_long> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  std::tr1::get<1,char*,unsigned_long,void,void,void,void,void,void,void,void>
            ((tuple<char_*,_unsigned_long,_void,_void,_void,_void,_void,_void,_void,_void> *)
             0x1ba886);
  StringMatchResultListener::StringMatchResultListener(in_stack_fffffffffffffe00);
  bVar1 = MatcherBase<unsigned_long>::MatchAndExplain
                    ((MatcherBase<unsigned_long> *)in_stack_fffffffffffffde0,
                     (unsigned_long)in_stack_fffffffffffffdd8,(MatchResultListener *)0x1ba8c3);
  if (!bVar1) {
    this = std::operator<<((ostream *)in_RDX,"  Expected arg #");
    in_stack_fffffffffffffde0 = (StringMatchResultListener *)std::ostream::operator<<(this,1);
    std::operator<<((ostream *)in_stack_fffffffffffffde0,": ");
    this_00 = (StringMatchResultListener *)
              std::tr1::
              get<1,testing::Matcher<char*>,testing::Matcher<unsigned_long>,void,void,void,void,void,void,void,void>
                        ((tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
                          *)0x1ba928);
    MatcherBase<unsigned_long>::DescribeTo
              ((MatcherBase<unsigned_long> *)in_stack_fffffffffffffde0,(ostream *)this_00);
    std::operator<<((ostream *)in_RDX,"\n           Actual: ");
    UniversalPrint<unsigned_long>((unsigned_long *)in_stack_fffffffffffffde0,(ostream *)this_00);
    StringMatchResultListener::str_abi_cxx11_(this_00);
    PrintIfNotEmpty((string *)in_stack_fffffffffffffde0,(ostream *)this_00);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
    std::operator<<((ostream *)in_RDX,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener(in_stack_fffffffffffffde0);
  Matcher<unsigned_long>::~Matcher((Matcher<unsigned_long> *)0x1baa18);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    using ::std::tr1::tuple_element;
    using ::std::tr1::get;

    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }